

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTcPrsOpAsi::parse(CTcPrsOpAsi *this)

{
  tc_toktyp_t tVar1;
  int iVar2;
  tc_toktyp_t op;
  char *pcVar3;
  long lVar4;
  undefined8 *in_RDI;
  CTcPrsNode *rhs;
  tc_toktyp_t curtyp;
  CTcPrsNode *lhs;
  CTcPrsNode *in_stack_ffffffffffffff60;
  CTcTokenizer *in_stack_ffffffffffffff68;
  CTPNAsi *in_stack_ffffffffffffff70;
  CTcPrsOpIf *in_stack_ffffffffffffff88;
  CTPNShlAsi *local_18;
  CTPNShlAsi *local_8;
  
  local_8 = (CTPNShlAsi *)CTcPrsOpIf::parse(in_stack_ffffffffffffff88);
  if (local_8 == (CTPNShlAsi *)0x0) {
    local_8 = (CTPNShlAsi *)0x0;
  }
  else {
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x24fc1b);
    if ((tVar1 - TOKT_PLUSEQ < 0xb) || (tVar1 == *(tc_toktyp_t *)(in_RDI + 1))) {
      iVar2 = (*(local_8->super_CTPNBin).super_CTPNBinBase.super_CTcPrsNode.super_CTcPrsNodeBase.
                _vptr_CTcPrsNodeBase[3])();
      if (iVar2 == 0) {
        op = CTcTokenizer::cur((CTcTokenizer *)0x24fc7f);
        pcVar3 = CTcTokenizer::get_op_text(op);
        CTcTokenizer::log_error(0x2afc,pcVar3);
      }
      CTcTokenizer::next(in_stack_ffffffffffffff68);
      lVar4 = (**(code **)*in_RDI)();
      if (lVar4 == 0) {
        local_8 = (CTPNShlAsi *)0x0;
      }
      else {
        switch(tVar1) {
        case TOKT_PLUSEQ:
          local_18 = (CTPNShlAsi *)CTcPrsAllocObj::operator_new(0x24fd0b);
          CTPNAddAsi::CTPNAddAsi
                    ((CTPNAddAsi *)in_stack_ffffffffffffff70,(CTcPrsNode *)in_stack_ffffffffffffff68
                     ,in_stack_ffffffffffffff60);
          break;
        case TOKT_MINEQ:
          local_18 = (CTPNShlAsi *)CTcPrsAllocObj::operator_new(0x24fd6b);
          CTPNSubAsi::CTPNSubAsi
                    ((CTPNSubAsi *)in_stack_ffffffffffffff70,(CTcPrsNode *)in_stack_ffffffffffffff68
                     ,in_stack_ffffffffffffff60);
          break;
        case TOKT_TIMESEQ:
          local_18 = (CTPNShlAsi *)CTcPrsAllocObj::operator_new(0x24fdcb);
          CTPNMulAsi::CTPNMulAsi
                    ((CTPNMulAsi *)in_stack_ffffffffffffff70,(CTcPrsNode *)in_stack_ffffffffffffff68
                     ,in_stack_ffffffffffffff60);
          break;
        case TOKT_DIVEQ:
          local_18 = (CTPNShlAsi *)CTcPrsAllocObj::operator_new(0x24fe2b);
          CTPNDivAsi::CTPNDivAsi
                    ((CTPNDivAsi *)in_stack_ffffffffffffff70,(CTcPrsNode *)in_stack_ffffffffffffff68
                     ,in_stack_ffffffffffffff60);
          break;
        case TOKT_MODEQ:
          local_18 = (CTPNShlAsi *)CTcPrsAllocObj::operator_new(0x24fe8b);
          CTPNModAsi::CTPNModAsi
                    ((CTPNModAsi *)in_stack_ffffffffffffff70,(CTcPrsNode *)in_stack_ffffffffffffff68
                     ,in_stack_ffffffffffffff60);
          break;
        case TOKT_ANDEQ:
          local_18 = (CTPNShlAsi *)CTcPrsAllocObj::operator_new(0x24feeb);
          CTPNBAndAsi::CTPNBAndAsi
                    ((CTPNBAndAsi *)in_stack_ffffffffffffff70,
                     (CTcPrsNode *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
          break;
        case TOKT_OREQ:
          local_18 = (CTPNShlAsi *)CTcPrsAllocObj::operator_new(0x24ff4b);
          CTPNBOrAsi::CTPNBOrAsi
                    ((CTPNBOrAsi *)in_stack_ffffffffffffff70,(CTcPrsNode *)in_stack_ffffffffffffff68
                     ,in_stack_ffffffffffffff60);
          break;
        case TOKT_XOREQ:
          local_18 = (CTPNShlAsi *)CTcPrsAllocObj::operator_new(0x24ffab);
          CTPNBXorAsi::CTPNBXorAsi
                    ((CTPNBXorAsi *)in_stack_ffffffffffffff70,
                     (CTcPrsNode *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
          break;
        case TOKT_SHLEQ:
          local_18 = (CTPNShlAsi *)CTcPrsAllocObj::operator_new(0x25000b);
          CTPNShlAsi::CTPNShlAsi
                    (local_18,(CTcPrsNode *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
          break;
        case TOKT_ASHREQ:
          local_18 = (CTPNShlAsi *)CTcPrsAllocObj::operator_new(0x25006b);
          CTPNAShrAsi::CTPNAShrAsi
                    ((CTPNAShrAsi *)in_stack_ffffffffffffff70,(CTcPrsNode *)local_18,
                     in_stack_ffffffffffffff60);
          break;
        case TOKT_LSHREQ:
          local_18 = (CTPNShlAsi *)CTcPrsAllocObj::operator_new(0x2500cb);
          CTPNLShrAsi::CTPNLShrAsi
                    ((CTPNLShrAsi *)in_stack_ffffffffffffff70,
                     (CTcPrsNode *)in_stack_ffffffffffffff68,(CTcPrsNode *)local_18);
          break;
        default:
          local_18 = (CTPNShlAsi *)CTcPrsAllocObj::operator_new(0x250125);
          CTPNAsi::CTPNAsi(in_stack_ffffffffffffff70,(CTcPrsNode *)in_stack_ffffffffffffff68,
                           in_stack_ffffffffffffff60);
        }
        local_8 = local_18;
      }
    }
  }
  return (CTcPrsNode *)local_8;
}

Assistant:

CTcPrsNode *CTcPrsOpAsi::parse() const
{
    /* start by parsing a conditional subexpression */
    CTcPrsNode *lhs = S_op_if.parse();
    if (lhs == 0)
        return 0;

    /* get the next operator */
    tc_toktyp_t curtyp = G_tok->cur();

    /* check to see if it's an assignment operator of some kind */
    switch(curtyp)
    {
    case TOKT_PLUSEQ:
    case TOKT_MINEQ:
    case TOKT_TIMESEQ:
    case TOKT_DIVEQ:
    case TOKT_MODEQ:
    case TOKT_ANDEQ:
    case TOKT_OREQ:
    case TOKT_XOREQ:
    case TOKT_SHLEQ:
    case TOKT_ASHREQ:
    case TOKT_LSHREQ:
        /* it's an assignment operator - process it */
        break;
        
    default:
        /* check against the current simple-assignment operator */
        if (curtyp == asi_op_)
        {
            /* it's an assignment operator - process it */
            break;
        }
        else
        {
            /* 
             *   it's not an assignment - return the original
             *   subexpression with no further elaboration 
             */
            return lhs;
        }
    }

    /* check for a valid lvalue */
    if (!lhs->check_lvalue())
    {
        /* log an error but continue parsing */
        G_tok->log_error(TCERR_INVALID_LVALUE,
                         G_tok->get_op_text(G_tok->cur()));
    }

    /* skip the assignment operator */
    G_tok->next();
    
    /* 
     *   Recursively parse an assignment subexpression.  Do this
     *   recursively rather than iteratively, because assignment operators
     *   group right-to-left.  By recursively parsing an assignment, our
     *   right-hand side will contain all remaining assignment expressions
     *   incorporated into it.  
     */
    CTcPrsNode *rhs = parse();
    if (rhs == 0)
        return 0;

    /* build and return the result based on the operator type */
    switch(curtyp)
    {
    case TOKT_PLUSEQ:
        lhs = new CTPNAddAsi(lhs, rhs);
        break;
        
    case TOKT_MINEQ:
        lhs = new CTPNSubAsi(lhs, rhs);
        break;
        
    case TOKT_TIMESEQ:
        lhs = new CTPNMulAsi(lhs, rhs);
        break;

    case TOKT_DIVEQ:
        lhs = new CTPNDivAsi(lhs, rhs);
        break;

    case TOKT_MODEQ:
        lhs = new CTPNModAsi(lhs, rhs);
        break;

    case TOKT_ANDEQ:
        lhs = new CTPNBAndAsi(lhs, rhs);
        break;

    case TOKT_OREQ:
        lhs = new CTPNBOrAsi(lhs, rhs);
        break;

    case TOKT_XOREQ:
        lhs = new CTPNBXorAsi(lhs, rhs);
        break;

    case TOKT_SHLEQ:
        lhs = new CTPNShlAsi(lhs, rhs);
        break;

    case TOKT_ASHREQ:
        lhs = new CTPNAShrAsi(lhs, rhs);
        break;

    case TOKT_LSHREQ:
        lhs = new CTPNLShrAsi(lhs, rhs);
        break;

    default:
        /* plain assignment operator */
        lhs = new CTPNAsi(lhs, rhs);
        break;
    }

    /* return the result */
    return lhs;
}